

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::updateThresholdLbChange
          (HighsDomain *this,HighsInt col,double newbound,double val,double *threshold)

{
  double dVar1;
  double dVar2;
  double dVar3;
  initializer_list<double> __l;
  double local_20;
  double local_18;
  double local_10;
  
  dVar2 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  if ((dVar2 != newbound) || (NAN(dVar2) || NAN(newbound))) {
    local_10 = ((this->mipsolver->mipdata_)._M_t.
                super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
                _M_t.
                super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    dVar1 = local_10;
    if ((this->mipsolver->model_->integrality_).
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start[col] == kContinuous) {
      dVar3 = (dVar2 - newbound) * 0.3;
      dVar1 = local_10 * 1000.0;
      if (local_10 * 1000.0 <= dVar3) {
        dVar1 = dVar3;
      }
    }
    local_18 = ABS(val) * ((dVar2 - newbound) - dVar1);
    local_20 = *threshold;
    __l._M_len = 3;
    __l._M_array = &local_20;
    dVar2 = std::max<double>(__l);
    *threshold = dVar2;
  }
  return;
}

Assistant:

void HighsDomain::updateThresholdLbChange(HighsInt col, double newbound,
                                          double val, double& threshold) {
  if (newbound != col_upper_[col]) {
    double thresholdNew =
        std::fabs(val) * boundRange(col_upper_[col], newbound,
                                    mipsolver->mipdata_->feastol,
                                    variableType(col));

    // the new threshold is now the maximum of the new threshold and the current
    // one
    threshold =
        std::max({threshold, thresholdNew, mipsolver->mipdata_->feastol});
  }
}